

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O2

void operations_test<viennamath::ct_constant<7l>,viennamath::ct_variable<0ul>>
               (ct_constant<7L> *t,ct_variable<0UL> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  local_2a;
  double local_28;
  double local_20;
  double local_18;
  
  local_28 = t2;
  local_20 = u2;
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<(poVar1,t);
  poVar1 = std::operator<<(poVar1,", RHS: ");
  poVar1 = viennamath::operator<<(poVar1,u);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_18 = local_28 + local_20;
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>>
            (&local_2a,local_18);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<7l>>>
            ((ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<7L>_>
              *)&local_2a,local_18);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>
            ((ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_2a,local_28 - local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_minus<double>,viennamath::ct_constant<7l>>>
            ((ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_minus<double>,_viennamath::ct_constant<7L>_>
              *)&local_2a,local_20 - local_28);
  local_18 = local_28 * local_20;
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            ((ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)&local_2a,local_18);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<7l>>>
            ((ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<7L>_>
              *)&local_2a,local_18);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>
            ((ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
              *)&local_2a,local_28 / local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_div<double>,viennamath::ct_constant<7l>>>
            ((ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>
              *)&local_2a,local_20 / local_28);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << ", RHS: " << u << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}